

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::ProcessBuildsystemFile(cmMakefile *this,char *filename)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  cmListFile listFile;
  string curSrc;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  cmListFile local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"CMAKE_PARENT_LIST_FILE",(allocator *)&local_78);
  AddDefinition(this,&local_38,filename);
  std::__cxx11::string::~string((string *)&local_38);
  pcVar3 = cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
  std::__cxx11::string::string((string *)&local_38,pcVar3,(allocator *)&local_78);
  std::__cxx11::string::string((string *)&local_78,filename,(allocator *)&local_58);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->ListFileStack,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  local_58.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar3 = GetHomeDirectory(this);
  bVar1 = std::operator==(&local_38,pcVar3);
  bVar1 = cmListFile::ParseFile(&local_58,filename,bVar1,this);
  if (bVar1) {
    PushPolicyBarrier(this);
    std::__cxx11::string::string((string *)&local_78,filename,&local_79);
    ReadListFile(this,&local_58,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    bVar2 = cmSystemTools::GetFatalErrorOccured();
    PopPolicyBarrier(this,!bVar2);
    EnforceDirectoryLevelRules(this);
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector(&local_58.Functions)
  ;
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool cmMakefile::ProcessBuildsystemFile(const char* filename)
{
  this->AddDefinition("CMAKE_PARENT_LIST_FILE", filename);
  std::string curSrc = this->GetCurrentSourceDirectory();

  this->ListFileStack.push_back(filename);

  cmListFile listFile;
  if (!listFile.ParseFile(filename, curSrc == this->GetHomeDirectory(), this))
    {
    return false;
    }

  this->PushPolicyBarrier();
  this->ReadListFile(listFile, filename);
  this->PopPolicyBarrier(!cmSystemTools::GetFatalErrorOccured());
  this->EnforceDirectoryLevelRules();
  return true;
}